

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ChUtilsCreators.cpp
# Opt level: O2

bool chrono::utils::AddTriangleMeshConvexDecomposition
               (ChBody *body,shared_ptr<chrono::ChMaterialSurface> *material,string *obj_filename,
               string *name,ChVector<double> *pos,ChQuaternion<double> *rot,float skin_thickness,
               bool use_original_asset,shared_ptr<chrono::ChVisualMaterial> vis_material)

{
  double *pdVar1;
  double dVar2;
  pointer pCVar3;
  double dVar4;
  element_type *peVar5;
  undefined8 this;
  _func_int **pp_Var6;
  element_type *peVar7;
  bool bVar8;
  uint uVar9;
  ostream *poVar10;
  int i;
  uint hullIndex;
  ulong uVar11;
  long lVar12;
  shared_ptr<chrono::geometry::ChTriangleMeshConnected> trimesh_convex;
  shared_ptr<chrono::ChTriangleMeshShape> trimesh_shape;
  shared_ptr<chrono::ChTriangleMeshShape> trimesh_shape_1;
  shared_ptr<chrono::geometry::ChTriangleMeshConnected> trimesh;
  shared_ptr<chrono::ChVisualShape> local_398;
  undefined1 local_388 [16];
  vector<chrono::ChVector<double>,_std::allocator<chrono::ChVector<double>_>_> convexhull;
  __shared_ptr<chrono::ChVisualMaterial,_(__gnu_cxx::_Lock_policy)2> local_358;
  __shared_ptr<chrono::geometry::ChTriangleMeshConnected,_(__gnu_cxx::_Lock_policy)2> local_348;
  __shared_ptr<chrono::ChVisualShape,(__gnu_cxx::_Lock_policy)2> local_338 [8];
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_330;
  __shared_ptr<chrono::ChVisualMaterial,_(__gnu_cxx::_Lock_policy)2> local_328;
  __shared_ptr<chrono::geometry::ChTriangleMeshConnected,_(__gnu_cxx::_Lock_policy)2> local_318;
  __shared_ptr<chrono::ChMaterialSurface,_(__gnu_cxx::_Lock_policy)2> local_308;
  __shared_ptr<chrono::ChVisualModel,_(__gnu_cxx::_Lock_policy)2> local_2f8;
  undefined1 local_2e8 [40];
  ChConvexDecompositionHACDv2 decomposition;
  ChFrame<double> local_240;
  shared_ptr<chrono::ChVisualModel> model;
  double local_1a8 [47];
  
  ChPhysicsItem::GetVisualModel((ChPhysicsItem *)&model);
  peVar7 = model.super___shared_ptr<chrono::ChVisualModel,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            (&model.super___shared_ptr<chrono::ChVisualModel,_(__gnu_cxx::_Lock_policy)2>.
              _M_refcount);
  if (peVar7 == (element_type *)0x0) {
    std::make_shared<chrono::ChVisualModel>();
    std::__shared_ptr<chrono::ChVisualModel,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr
              (&local_2f8,
               &model.super___shared_ptr<chrono::ChVisualModel,_(__gnu_cxx::_Lock_policy)2>);
    ChPhysicsItem::AddVisualModel
              (&body->super_ChPhysicsItem,(shared_ptr<chrono::ChVisualModel> *)&local_2f8);
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_2f8._M_refcount);
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
              (&model.super___shared_ptr<chrono::ChVisualModel,_(__gnu_cxx::_Lock_policy)2>.
                _M_refcount);
  }
  bVar8 = false;
  geometry::ChTriangleMeshConnected::CreateFromWavefrontFile
            ((ChTriangleMeshConnected *)&trimesh,obj_filename,true,false);
  if (trimesh.
      super___shared_ptr<chrono::geometry::ChTriangleMeshConnected,_(__gnu_cxx::_Lock_policy)2>.
      _M_ptr != (element_type *)0x0) {
    lVar12 = 0;
    for (uVar11 = 0;
        pCVar3 = ((trimesh.
                   super___shared_ptr<chrono::geometry::ChTriangleMeshConnected,_(__gnu_cxx::_Lock_policy)2>
                  ._M_ptr)->m_vertices).
                 super__Vector_base<chrono::ChVector<double>,_std::allocator<chrono::ChVector<double>_>_>
                 ._M_impl.super__Vector_impl_data._M_start,
        uVar11 < (ulong)(((long)((trimesh.
                                  super___shared_ptr<chrono::geometry::ChTriangleMeshConnected,_(__gnu_cxx::_Lock_policy)2>
                                 ._M_ptr)->m_vertices).
                                super__Vector_base<chrono::ChVector<double>,_std::allocator<chrono::ChVector<double>_>_>
                                ._M_impl.super__Vector_impl_data._M_finish - (long)pCVar3) / 0x18);
        uVar11 = uVar11 + 1) {
      ChQuaternion<double>::Rotate(rot,(ChVector<double> *)((long)pCVar3->m_data + lVar12));
      dVar2 = pos->m_data[2];
      dVar4 = pos->m_data[1];
      pCVar3 = ((trimesh.
                 super___shared_ptr<chrono::geometry::ChTriangleMeshConnected,_(__gnu_cxx::_Lock_policy)2>
                ._M_ptr)->m_vertices).
               super__Vector_base<chrono::ChVector<double>,_std::allocator<chrono::ChVector<double>_>_>
               ._M_impl.super__Vector_impl_data._M_start;
      pdVar1 = (double *)((long)pCVar3->m_data + lVar12);
      *pdVar1 = pos->m_data[0] +
                (double)model.super___shared_ptr<chrono::ChVisualModel,_(__gnu_cxx::_Lock_policy)2>.
                        _M_ptr;
      pdVar1[1] = dVar4 + (double)model.
                                  super___shared_ptr<chrono::ChVisualModel,_(__gnu_cxx::_Lock_policy)2>
                                  ._M_refcount._M_pi;
      *(double *)((long)pCVar3->m_data + lVar12 + 0x10) = dVar2 + local_1a8[0];
      lVar12 = lVar12 + 0x18;
    }
    collision::ChConvexDecompositionHACDv2::ChConvexDecompositionHACDv2(&decomposition);
    collision::ChConvexDecompositionHACDv2::Reset(&decomposition);
    collision::ChConvexDecompositionHACDv2::AddTriangleMesh
              (&decomposition,
               &(trimesh.
                 super___shared_ptr<chrono::geometry::ChTriangleMeshConnected,_(__gnu_cxx::_Lock_policy)2>
                ._M_ptr)->super_ChTriangleMesh);
    collision::ChConvexDecompositionHACDv2::SetParameters
              (&decomposition,0x200,0x100,0x40,0.2,0.0,1e-09);
    collision::ChConvexDecompositionHACDv2::ComputeConvexDecomposition(&decomposition);
    uVar9 = collision::ChConvexDecompositionHACDv2::GetHullCount(&decomposition);
    convexhull.
    super__Vector_base<chrono::ChVector<double>,_std::allocator<chrono::ChVector<double>_>_>._M_impl
    .super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    convexhull.
    super__Vector_base<chrono::ChVector<double>,_std::allocator<chrono::ChVector<double>_>_>._M_impl
    .super__Vector_impl_data._M_start = (pointer)0x0;
    convexhull.
    super__Vector_base<chrono::ChVector<double>,_std::allocator<chrono::ChVector<double>_>_>._M_impl
    .super__Vector_impl_data._M_finish = (pointer)0x0;
    for (hullIndex = 0; (~((int)uVar9 >> 0x1f) & uVar9) != hullIndex; hullIndex = hullIndex + 1) {
      collision::ChConvexDecompositionHACDv2::GetConvexHullResult
                (&decomposition,hullIndex,&convexhull);
      std::__shared_ptr<chrono::collision::ChCollisionModel,_(__gnu_cxx::_Lock_policy)2>::
      __shared_ptr((__shared_ptr<chrono::collision::ChCollisionModel,_(__gnu_cxx::_Lock_policy)2> *)
                   &local_240,
                   &(body->collision_model).
                    super___shared_ptr<chrono::collision::ChCollisionModel,_(__gnu_cxx::_Lock_policy)2>
                  );
      pp_Var6 = local_240._vptr_ChFrame;
      std::__shared_ptr<chrono::ChMaterialSurface,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr
                (&local_308,
                 &material->
                  super___shared_ptr<chrono::ChMaterialSurface,_(__gnu_cxx::_Lock_policy)2>);
      ChMatrix33<double>::Set_A_quaternion((ChMatrix33<double> *)&model,rot);
      (**(code **)(*pp_Var6 + 0x78))
                (pp_Var6,&local_308,&convexhull,pos,(ChMatrix33<double> *)&model);
      std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_308._M_refcount);
      std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
                ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)&local_240.coord);
      if (!use_original_asset) {
        std::__cxx11::stringstream::stringstream((stringstream *)&model);
        poVar10 = std::operator<<((ostream *)local_1a8,(string *)name);
        poVar10 = std::operator<<(poVar10,"_");
        std::ostream::operator<<(poVar10,hullIndex);
        std::make_shared<chrono::geometry::ChTriangleMeshConnected>();
        bVar8 = collision::ChConvexDecompositionHACDv2::GetConvexHullResult
                          (&decomposition,hullIndex,
                           &(trimesh_convex.
                             super___shared_ptr<chrono::geometry::ChTriangleMeshConnected,_(__gnu_cxx::_Lock_policy)2>
                            ._M_ptr)->super_ChTriangleMesh);
        if (!bVar8) {
          std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
                    (&trimesh_convex.
                      super___shared_ptr<chrono::geometry::ChTriangleMeshConnected,_(__gnu_cxx::_Lock_policy)2>
                      ._M_refcount);
          std::__cxx11::stringstream::~stringstream((stringstream *)&model);
          goto LAB_00e332e7;
        }
        chrono_types::make_shared<chrono::ChTriangleMeshShape,_0>();
        peVar5 = trimesh_shape.
                 super___shared_ptr<chrono::ChTriangleMeshShape,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
        std::__shared_ptr<chrono::geometry::ChTriangleMeshConnected,_(__gnu_cxx::_Lock_policy)2>::
        __shared_ptr(&local_318,
                     &trimesh_convex.
                      super___shared_ptr<chrono::geometry::ChTriangleMeshConnected,_(__gnu_cxx::_Lock_policy)2>
                    );
        ChTriangleMeshShape::SetMesh
                  (peVar5,(shared_ptr<chrono::geometry::ChTriangleMeshConnected> *)&local_318,true);
        std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_318._M_refcount);
        peVar5 = trimesh_shape.
                 super___shared_ptr<chrono::ChTriangleMeshShape,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
        std::__cxx11::stringbuf::str();
        std::__cxx11::string::_M_assign((string *)&peVar5->name);
        std::__cxx11::string::~string((string *)&local_240);
        peVar5 = trimesh_shape.
                 super___shared_ptr<chrono::ChTriangleMeshShape,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
        std::__shared_ptr<chrono::ChVisualMaterial,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr
                  (&local_328,
                   (__shared_ptr<chrono::ChVisualMaterial,_(__gnu_cxx::_Lock_policy)2> *)
                   vis_material.
                   super___shared_ptr<chrono::ChVisualMaterial,_(__gnu_cxx::_Lock_policy)2>._M_ptr);
        ChVisualShape::AddMaterial
                  (&peVar5->super_ChVisualShape,(shared_ptr<chrono::ChVisualMaterial> *)&local_328);
        std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_328._M_refcount);
        ChPhysicsItem::GetVisualModel((ChPhysicsItem *)local_388);
        this = local_388._0_8_;
        std::__shared_ptr<chrono::ChVisualShape,(__gnu_cxx::_Lock_policy)2>::
        __shared_ptr<chrono::ChTriangleMeshShape,void>
                  (local_338,
                   &trimesh_shape.
                    super___shared_ptr<chrono::ChTriangleMeshShape,_(__gnu_cxx::_Lock_policy)2>);
        local_2e8._0_8_ = &DAT_3ff0000000000000;
        local_2e8._24_8_ = 0;
        trimesh_shape_1.super___shared_ptr<chrono::ChTriangleMeshShape,_(__gnu_cxx::_Lock_policy)2>.
        _M_ptr = (element_type *)0x0;
        trimesh_shape_1.super___shared_ptr<chrono::ChTriangleMeshShape,_(__gnu_cxx::_Lock_policy)2>.
        _M_refcount._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
        local_2e8._8_8_ = (pointer)0x0;
        local_2e8._16_8_ = 0.0;
        ChFrame<double>::ChFrame
                  (&local_240,(ChVector<double> *)&trimesh_shape_1,(ChQuaternion<double> *)local_2e8
                  );
        ChVisualModel::AddShape
                  ((ChVisualModel *)this,(shared_ptr<chrono::ChVisualShape> *)local_338,&local_240);
        std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_330);
        std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
                  ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)(local_388 + 8));
        std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
                  (&trimesh_shape.
                    super___shared_ptr<chrono::ChTriangleMeshShape,_(__gnu_cxx::_Lock_policy)2>.
                    _M_refcount);
        std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
                  (&trimesh_convex.
                    super___shared_ptr<chrono::geometry::ChTriangleMeshConnected,_(__gnu_cxx::_Lock_policy)2>
                    ._M_refcount);
        std::__cxx11::stringstream::~stringstream((stringstream *)&model);
      }
    }
    if (use_original_asset) {
      chrono_types::make_shared<chrono::ChTriangleMeshShape,_0>();
      peVar5 = trimesh_shape_1.
               super___shared_ptr<chrono::ChTriangleMeshShape,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
      std::__shared_ptr<chrono::geometry::ChTriangleMeshConnected,_(__gnu_cxx::_Lock_policy)2>::
      __shared_ptr(&local_348,
                   &trimesh.
                    super___shared_ptr<chrono::geometry::ChTriangleMeshConnected,_(__gnu_cxx::_Lock_policy)2>
                  );
      ChTriangleMeshShape::SetMesh
                (peVar5,(shared_ptr<chrono::geometry::ChTriangleMeshConnected> *)&local_348,true);
      std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_348._M_refcount);
      std::__cxx11::string::_M_assign
                ((string *)
                 &(trimesh_shape_1.
                   super___shared_ptr<chrono::ChTriangleMeshShape,_(__gnu_cxx::_Lock_policy)2>.
                  _M_ptr)->name);
      peVar5 = trimesh_shape_1.
               super___shared_ptr<chrono::ChTriangleMeshShape,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
      std::__shared_ptr<chrono::ChVisualMaterial,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr
                (&local_358,
                 (__shared_ptr<chrono::ChVisualMaterial,_(__gnu_cxx::_Lock_policy)2> *)
                 vis_material.
                 super___shared_ptr<chrono::ChVisualMaterial,_(__gnu_cxx::_Lock_policy)2>._M_ptr);
      ChVisualShape::AddMaterial
                (&peVar5->super_ChVisualShape,(shared_ptr<chrono::ChVisualMaterial> *)&local_358);
      std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_358._M_refcount);
      ChPhysicsItem::GetVisualModel((ChPhysicsItem *)&trimesh_convex);
      std::__shared_ptr<chrono::ChVisualShape,(__gnu_cxx::_Lock_policy)2>::
      __shared_ptr<chrono::ChTriangleMeshShape,void>
                ((__shared_ptr<chrono::ChVisualShape,(__gnu_cxx::_Lock_policy)2> *)&local_398,
                 &trimesh_shape_1.
                  super___shared_ptr<chrono::ChTriangleMeshShape,_(__gnu_cxx::_Lock_policy)2>);
      local_240._vptr_ChFrame = (_func_int **)&DAT_3ff0000000000000;
      local_2e8._16_8_ = 0.0;
      local_240.coord.pos.m_data[2] = 0.0;
      local_2e8._0_8_ = (pointer)0x0;
      local_2e8._8_8_ = (pointer)0x0;
      local_240.coord.pos.m_data[0] = 0.0;
      local_240.coord.pos.m_data[1] = 0.0;
      ChFrame<double>::ChFrame
                ((ChFrame<double> *)&model,(ChVector<double> *)local_2e8,
                 (ChQuaternion<double> *)&local_240);
      ChVisualModel::AddShape
                ((ChVisualModel *)
                 trimesh_convex.
                 super___shared_ptr<chrono::geometry::ChTriangleMeshConnected,_(__gnu_cxx::_Lock_policy)2>
                 ._M_ptr,&local_398,(ChFrame<double> *)&model);
      std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
                (&local_398.super___shared_ptr<chrono::ChVisualShape,_(__gnu_cxx::_Lock_policy)2>.
                  _M_refcount);
      std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
                (&trimesh_convex.
                  super___shared_ptr<chrono::geometry::ChTriangleMeshConnected,_(__gnu_cxx::_Lock_policy)2>
                  ._M_refcount);
      std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
                (&trimesh_shape_1.
                  super___shared_ptr<chrono::ChTriangleMeshShape,_(__gnu_cxx::_Lock_policy)2>.
                  _M_refcount);
    }
LAB_00e332e7:
    bVar8 = (int)uVar9 <= (int)hullIndex;
    std::_Vector_base<chrono::ChVector<double>,_std::allocator<chrono::ChVector<double>_>_>::
    ~_Vector_base(&convexhull.
                   super__Vector_base<chrono::ChVector<double>,_std::allocator<chrono::ChVector<double>_>_>
                 );
    collision::ChConvexDecompositionHACDv2::~ChConvexDecompositionHACDv2(&decomposition);
  }
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            (&trimesh.
              super___shared_ptr<chrono::geometry::ChTriangleMeshConnected,_(__gnu_cxx::_Lock_policy)2>
              ._M_refcount);
  return bVar8;
}

Assistant:

bool AddTriangleMeshConvexDecomposition(ChBody* body,
                                        std::shared_ptr<ChMaterialSurface> material,
                                        const std::string& obj_filename,
                                        const std::string& name,
                                        const ChVector<>& pos,
                                        const ChQuaternion<>& rot,
                                        float skin_thickness,
                                        bool use_original_asset,
                                        std::shared_ptr<ChVisualMaterial> vis_material) {
    if (!body->GetVisualModel()) {
        auto model = chrono_types::make_shared<ChVisualModel>();
        body->AddVisualModel(model);
    }

    auto trimesh = geometry::ChTriangleMeshConnected::CreateFromWavefrontFile(obj_filename, true, false);
    if (!trimesh)
        return false;

    for (int i = 0; i < trimesh->m_vertices.size(); i++) {
        trimesh->m_vertices[i] = pos + rot.Rotate(trimesh->m_vertices[i]);
    }
    collision::ChConvexDecompositionHACDv2 decomposition;

    int hacd_maxhullcount = 512;
    int hacd_maxhullmerge = 256;
    int hacd_maxhullvertexes = 64;
    float hacd_concavity = 0.2f;
    float hacd_smallclusterthreshold = 0.0f;
    float hacd_fusetolerance = 1e-9f;

    decomposition.Reset();
    decomposition.AddTriangleMesh(*trimesh);

    decomposition.SetParameters(hacd_maxhullcount, hacd_maxhullmerge, hacd_maxhullvertexes, hacd_concavity,
                                hacd_smallclusterthreshold, hacd_fusetolerance);
    decomposition.ComputeConvexDecomposition();

    int hull_count = decomposition.GetHullCount();
    std::vector<ChVector<double>> convexhull;
    for (int c = 0; c < hull_count; c++) {
        decomposition.GetConvexHullResult(c, convexhull);

        body->GetCollisionModel()->AddConvexHull(material, convexhull, pos, rot);
        if (!use_original_asset) {
            std::stringstream ss;
            ss << name << "_" << c;
            auto trimesh_convex = chrono_types::make_shared<geometry::ChTriangleMeshConnected>();
            if (!decomposition.GetConvexHullResult(c, *trimesh_convex))
                return false;

            auto trimesh_shape = chrono_types::make_shared<ChTriangleMeshShape>();
            trimesh_shape->SetMesh(trimesh_convex);
            trimesh_shape->SetName(ss.str());
            trimesh_shape->AddMaterial(vis_material);
            body->GetVisualModel()->AddShape(trimesh_shape, ChFrame<>());
        }
    }

    if (use_original_asset) {
        auto trimesh_shape = chrono_types::make_shared<ChTriangleMeshShape>();
        trimesh_shape->SetMesh(trimesh);
        trimesh_shape->SetName(name);
        trimesh_shape->AddMaterial(vis_material);
        body->GetVisualModel()->AddShape(trimesh_shape, ChFrame<>());
    }

    return true;
}